

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O3

optional<pbrt::QuadricIntersection> * __thiscall
pbrt::Cylinder::BasicIntersect
          (optional<pbrt::QuadricIntersection> *__return_storage_ptr__,Cylinder *this,Ray *r,
          Float tMax)

{
  ulong uVar1;
  undefined8 uVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Interval<float> i;
  Interval<float> args;
  uint uVar7;
  int iVar8;
  Interval<float> i_00;
  Interval<float> i_01;
  undefined1 auVar9 [16];
  Interval<float> IVar10;
  Interval<float> IVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar17 [16];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined8 extraout_XMM0_Qb_01;
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  float fVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  float fVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  float fVar59;
  FloatInterval b;
  Vector3fi di;
  Point3fi oi;
  FloatInterval c;
  FloatInterval f;
  undefined1 local_128 [16];
  Interval<float> local_110;
  Point3fi local_108;
  Point3fi local_e8;
  undefined1 local_c8 [16];
  Vector3fi local_b8;
  Interval<float> local_a0;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  Interval<float> local_50;
  Interval<float> local_48;
  Interval<float> local_40;
  Interval<float> local_38;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 extraout_var_03 [60];
  undefined1 extraout_var_04 [60];
  undefined1 extraout_var_05 [56];
  undefined1 extraout_var_06 [56];
  undefined1 extraout_var_07 [56];
  undefined1 extraout_var_08 [56];
  undefined1 extraout_var_09 [56];
  undefined1 extraout_var_10 [56];
  undefined1 extraout_var_11 [56];
  undefined1 extraout_var_12 [56];
  undefined1 extraout_var_13 [56];
  undefined1 extraout_var_14 [56];
  undefined1 extraout_var_15 [56];
  undefined1 extraout_var_16 [56];
  
  fVar50 = (r->o).super_Tuple3<pbrt::Point3,_float>.x;
  auVar16._4_4_ = fVar50;
  auVar16._0_4_ = fVar50;
  auVar16._8_4_ = fVar50;
  auVar16._12_4_ = fVar50;
  fVar50 = (r->o).super_Tuple3<pbrt::Point3,_float>.y;
  auVar39._4_4_ = fVar50;
  auVar39._0_4_ = fVar50;
  auVar39._8_4_ = fVar50;
  auVar39._12_4_ = fVar50;
  fVar50 = (r->o).super_Tuple3<pbrt::Point3,_float>.z;
  auVar51._4_4_ = fVar50;
  auVar51._0_4_ = fVar50;
  auVar51._8_4_ = fVar50;
  auVar51._12_4_ = fVar50;
  local_108.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.
  _0_16_ = vmovlhps_avx(auVar16,auVar39);
  local_108.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.
  z = (Interval<float>)vmovlps_avx(auVar51);
  Transform::operator()(&local_e8,this->objectFromRender,&local_108);
  fVar50 = (r->d).super_Tuple3<pbrt::Vector3,_float>.x;
  auVar12._4_4_ = fVar50;
  auVar12._0_4_ = fVar50;
  auVar12._8_4_ = fVar50;
  auVar12._12_4_ = fVar50;
  fVar50 = (r->d).super_Tuple3<pbrt::Vector3,_float>.y;
  auVar40._4_4_ = fVar50;
  auVar40._0_4_ = fVar50;
  auVar40._8_4_ = fVar50;
  auVar40._12_4_ = fVar50;
  fVar50 = (r->d).super_Tuple3<pbrt::Vector3,_float>.z;
  auVar52._4_4_ = fVar50;
  auVar52._0_4_ = fVar50;
  auVar52._8_4_ = fVar50;
  auVar52._12_4_ = fVar50;
  local_b8.super_Vector3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Vector3,_pbrt::Interval<float>_>
  ._0_16_ = vmovlhps_avx(auVar12,auVar40);
  local_b8.super_Vector3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Vector3,_pbrt::Interval<float>_>
  .z = (Interval<float>)vmovlps_avx(auVar52);
  Transform::operator()((Vector3fi *)&local_108,this->objectFromRender,&local_b8);
  IVar10 = SumSquares<float,pbrt::Interval<float>>
                     (local_108.super_Point3<pbrt::Interval<float>_>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x,
                      local_108.super_Point3<pbrt::Interval<float>_>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y);
  local_c8._8_8_ = extraout_XMM0_Qb;
  local_c8._0_4_ = IVar10.low;
  local_c8._4_4_ = IVar10.high;
  IVar10.high = local_e8.super_Point3<pbrt::Interval<float>_>.
                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
  IVar10.low = local_e8.super_Point3<pbrt::Interval<float>_>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
  auVar20._0_8_ = Interval<float>::operator*<float>((Interval<float> *)&local_108,IVar10);
  auVar20._8_56_ = extraout_var_05;
  local_a0 = (Interval<float>)vmovlps_avx(auVar20._0_16_);
  i.high = local_e8.super_Point3<pbrt::Interval<float>_>.
           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
  i.low = local_e8.super_Point3<pbrt::Interval<float>_>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
  IVar10 = Interval<float>::operator*<float>
                     (&local_108.super_Point3<pbrt::Interval<float>_>.
                       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y,i);
  IVar11 = Interval<float>::operator+<float>(&local_a0,IVar10);
  auVar41._8_4_ = 0x40000000;
  auVar41._0_8_ = 0x4000000040000000;
  auVar41._12_4_ = 0x40000000;
  IVar10 = (Interval<float>)vmovlps_avx(auVar41);
  local_b8.super_Vector3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Vector3,_pbrt::Interval<float>_>
  .x = IVar10;
  auVar21._0_8_ = Interval<float>::operator*<float>((Interval<float> *)&local_b8,IVar11);
  auVar21._8_56_ = extraout_var_06;
  local_110 = (Interval<float>)vmovlps_avx(auVar21._0_16_);
  IVar11.high = local_e8.super_Point3<pbrt::Interval<float>_>.
                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
  IVar11.low = local_e8.super_Point3<pbrt::Interval<float>_>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
  args.high = local_e8.super_Point3<pbrt::Interval<float>_>.
              super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
  args.low = local_e8.super_Point3<pbrt::Interval<float>_>.
             super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
  auVar22._0_8_ = SumSquares<float,pbrt::Interval<float>>(IVar11,args);
  auVar22._8_56_ = extraout_var_07;
  local_b8.super_Vector3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Vector3,_pbrt::Interval<float>_>
  .x = (Interval<float>)vmovlps_avx(auVar22._0_16_);
  fVar50 = this->radius;
  fVar38 = fVar50 * fVar50;
  auVar16 = ZEXT416((uint)fVar38);
  if ((fVar50 != 0.0) || (NAN(fVar50))) {
    uVar2 = vcmpss_avx512f(auVar16,ZEXT816(0) << 0x40,0);
    bVar3 = (bool)((byte)uVar2 & 1);
    fVar50 = (float)((uint)bVar3 * -0x80000000 + (uint)!bVar3 * (int)fVar38);
    auVar12 = SUB6416(ZEXT464(0x7f800000),0);
    if (fVar38 < INFINITY) {
      auVar53._0_12_ = ZEXT812(0);
      auVar53._12_4_ = 0;
      uVar2 = vcmpss_avx512f(auVar16,auVar53,0);
      fVar38 = (float)((uint)!(bool)((byte)uVar2 & 1) * (int)fVar38);
      auVar12 = ZEXT416((-(uint)(fVar38 < 0.0) | 1) + (int)fVar38);
    }
    auVar16 = ZEXT416((int)fVar50 + -1 + (uint)(fVar50 <= 0.0) * 2);
    auVar39 = vminss_avx(auVar12,auVar16);
    auVar16 = vmaxss_avx(auVar12,auVar16);
    auVar16 = vinsertps_avx(auVar39,auVar16,0x10);
    i_00 = auVar16._0_8_;
  }
  else {
    uVar7 = 0x7f800000;
    if (fVar38 < INFINITY) {
      auVar42._0_12_ = ZEXT812(0);
      auVar42._12_4_ = 0;
      uVar2 = vcmpss_avx512f(auVar16,auVar42,0);
      uVar7 = (uint)!(bool)((byte)uVar2 & 1) * (int)fVar38 + 1;
    }
    auVar43._4_4_ = uVar7;
    auVar43._0_4_ = uVar7;
    auVar43._8_4_ = uVar7;
    auVar43._12_4_ = uVar7;
    auVar4._12_4_ = 0;
    auVar4._0_12_ = ZEXT812(0);
    auVar16 = vblendps_avx(auVar43,auVar4 << 0x20,0xd);
    uVar1 = vcmpps_avx512vl(ZEXT416(uVar7),auVar16,1);
    i_00.high = (float)(((byte)(uVar1 >> 1) & 1) * uVar7);
    i_00.low = (float)(((byte)uVar1 & 1) * uVar7);
  }
  auVar23._0_8_ = Interval<float>::operator-<float>((Interval<float> *)&local_b8,i_00);
  auVar23._8_56_ = extraout_var_08;
  local_a0 = (Interval<float>)vmovlps_avx(auVar23._0_16_);
  auVar13._8_4_ = 0x40000000;
  auVar13._0_8_ = 0x4000000040000000;
  auVar13._12_4_ = 0x40000000;
  local_b8.super_Vector3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Vector3,_pbrt::Interval<float>_>
  .x = (Interval<float>)vmovlps_avx(auVar13);
  IVar10 = Interval<float>::operator*<float>
                     ((Interval<float> *)&local_b8,(Interval<float>)local_c8._0_8_);
  auVar24._0_8_ = Interval<float>::operator/<float>(&local_110,IVar10);
  auVar24._8_56_ = extraout_var_09;
  local_48 = (Interval<float>)vmovlps_avx(auVar24._0_16_);
  IVar10 = Interval<float>::operator*<float>
                     (&local_48,
                      local_108.super_Point3<pbrt::Interval<float>_>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x);
  IVar10 = Interval<float>::operator-<float>((Interval<float> *)&local_e8,IVar10);
  local_128._8_8_ = extraout_XMM0_Qb_00;
  local_128._0_4_ = IVar10.low;
  local_128._4_4_ = IVar10.high;
  IVar11 = Interval<float>::operator*<float>
                     (&local_48,
                      local_108.super_Point3<pbrt::Interval<float>_>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y);
  auVar25._0_8_ =
       Interval<float>::operator-<float>
                 (&local_e8.super_Point3<pbrt::Interval<float>_>.
                   super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y,IVar11);
  auVar25._8_56_ = extraout_var_10;
  auVar16 = vmovshdup_avx(local_128);
  fVar38 = IVar10.low;
  fVar59 = auVar16._0_4_;
  auVar16 = vmaxss_avx(ZEXT416((uint)(fVar38 * fVar38)),ZEXT416((uint)(fVar59 * fVar59)));
  fVar50 = auVar16._0_4_;
  if ((0.0 < fVar38) || (fVar59 < 0.0)) {
    auVar12 = vminss_avx(ZEXT416((uint)(fVar59 * fVar59)),ZEXT416((uint)(fVar38 * fVar38)));
    uVar2 = vcmpss_avx512f(auVar12,ZEXT816(0) << 0x40,0);
    bVar3 = (bool)((byte)uVar2 & 1);
    fVar38 = (float)((uint)bVar3 * -0x80000000 + (uint)!bVar3 * auVar12._0_4_);
    auVar12 = SUB6416(ZEXT464(0x7f800000),0);
    if (fVar50 < INFINITY) {
      auVar58._0_12_ = ZEXT812(0);
      auVar58._12_4_ = 0;
      uVar2 = vcmpss_avx512f(auVar16,auVar58,0);
      fVar50 = (float)((uint)!(bool)((byte)uVar2 & 1) * (int)fVar50);
      auVar12 = ZEXT416((-(uint)(fVar50 < 0.0) | 1) + (int)fVar50);
    }
    auVar16 = ZEXT416((int)fVar38 + -1 + (uint)(fVar38 <= 0.0) * 2);
    auVar39 = vminss_avx(auVar12,auVar16);
    auVar16 = vmaxss_avx(auVar12,auVar16);
    auVar9 = vinsertps_avx(auVar39,auVar16,0x10);
  }
  else {
    iVar8 = 0x7f800000;
    if (fVar50 < INFINITY) {
      auVar54._0_12_ = ZEXT812(0);
      auVar54._12_4_ = 0;
      uVar2 = vcmpss_avx512f(auVar16,auVar54,0);
      fVar50 = (float)((uint)!(bool)((byte)uVar2 & 1) * (int)fVar50);
      iVar8 = (-(uint)(fVar50 < 0.0) | 1) + (int)fVar50;
    }
    auVar55._4_4_ = iVar8;
    auVar55._0_4_ = iVar8;
    auVar55._8_4_ = iVar8;
    auVar55._12_4_ = iVar8;
    auVar16 = vblendps_avx(auVar55,ZEXT816(0) << 0x40,0xd);
    auVar44._4_12_ = SUB1612(ZEXT816(0) << 0x40,4);
    auVar44._0_4_ = iVar8;
    uVar1 = vcmpps_avx512vl(auVar44,auVar16,1);
    auVar9._4_4_ = (uint)((byte)(uVar1 >> 1) & 1) * iVar8;
    auVar9._0_4_ = (uint)((byte)uVar1 & 1) * iVar8;
    auVar9._8_4_ = (uint)((byte)(uVar1 >> 2) & 1) * iVar8;
    auVar9._12_4_ = (uint)((byte)(uVar1 >> 3) & 1) * iVar8;
  }
  auVar16 = vmovshdup_avx(auVar25._0_16_);
  fVar38 = auVar25._0_4_;
  uVar2 = vmovlps_avx(auVar9);
  local_b8.super_Vector3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Vector3,_pbrt::Interval<float>_>
  .x.low = (float)(int)uVar2;
  local_b8.super_Vector3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Vector3,_pbrt::Interval<float>_>
  .x.high = (float)(int)((ulong)uVar2 >> 0x20);
  fVar59 = auVar16._0_4_;
  auVar16 = vmaxss_avx(ZEXT416((uint)(fVar38 * fVar38)),ZEXT416((uint)(fVar59 * fVar59)));
  fVar50 = auVar16._0_4_;
  if ((0.0 < fVar38) || (fVar59 < 0.0)) {
    auVar12 = vminss_avx(ZEXT416((uint)(fVar59 * fVar59)),ZEXT416((uint)(fVar38 * fVar38)));
    uVar2 = vcmpss_avx512f(auVar12,ZEXT816(0) << 0x20,0);
    bVar3 = (bool)((byte)uVar2 & 1);
    fVar38 = (float)((uint)bVar3 * -0x80000000 + (uint)!bVar3 * auVar12._0_4_);
    auVar12 = SUB6416(ZEXT464(0x7f800000),0);
    if (fVar50 < INFINITY) {
      auVar56._0_12_ = ZEXT812(0);
      auVar56._12_4_ = 0;
      uVar2 = vcmpss_avx512f(auVar16,auVar56,0);
      fVar50 = (float)((uint)!(bool)((byte)uVar2 & 1) * (int)fVar50);
      auVar12 = ZEXT416((-(uint)(fVar50 < 0.0) | 1) + (int)fVar50);
    }
    auVar16 = ZEXT416((int)fVar38 + -1 + (uint)(fVar38 <= 0.0) * 2);
    auVar39 = vminss_avx(auVar12,auVar16);
    auVar16 = vmaxss_avx(auVar12,auVar16);
    auVar16 = vinsertps_avx(auVar39,auVar16,0x10);
    i_01 = auVar16._0_8_;
  }
  else {
    iVar8 = 0x7f800000;
    if (fVar50 < INFINITY) {
      auVar14._0_12_ = ZEXT812(0);
      auVar14._12_4_ = 0;
      uVar2 = vcmpss_avx512f(auVar16,auVar14,0);
      fVar50 = (float)((uint)!(bool)((byte)uVar2 & 1) * (int)fVar50);
      iVar8 = (-(uint)(fVar50 < 0.0) | 1) + (int)fVar50;
    }
    auVar15._4_4_ = iVar8;
    auVar15._0_4_ = iVar8;
    auVar15._8_4_ = iVar8;
    auVar15._12_4_ = iVar8;
    auVar16 = vblendps_avx(auVar15,ZEXT816(0) << 0x40,0xd);
    auVar45._4_12_ = SUB1612(ZEXT816(0) << 0x40,4);
    auVar45._0_4_ = iVar8;
    uVar1 = vcmpps_avx512vl(auVar45,auVar16,1);
    i_01.high = (float)((uint)((byte)(uVar1 >> 1) & 1) * iVar8);
    i_01.low = (float)((uint)((byte)uVar1 & 1) * iVar8);
  }
  auVar26._0_8_ = Interval<float>::operator+<float>((Interval<float> *)&local_b8,i_01);
  auVar26._8_56_ = extraout_var_11;
  auVar16 = auVar26._0_16_;
  if (auVar26._0_4_ < 0.0) {
    auVar27._0_4_ = sqrtf(auVar26._0_4_);
    auVar27._4_60_ = extraout_var;
    auVar12 = auVar27._0_16_;
  }
  else {
    auVar12 = vsqrtss_avx(auVar16,auVar16);
  }
  auVar39 = SUB6416(ZEXT464(0xff800000),0);
  if (-INFINITY < auVar12._0_4_) {
    uVar2 = vcmpss_avx512f(auVar12,ZEXT816(0) << 0x40,0);
    bVar3 = (bool)((byte)uVar2 & 1);
    fVar50 = (float)((uint)bVar3 * -0x80000000 + (uint)!bVar3 * (int)auVar12._0_4_);
    auVar39 = ZEXT416((int)fVar50 + -1 + (uint)(fVar50 <= 0.0) * 2);
  }
  auVar16 = vmovshdup_avx(auVar16);
  if (auVar16._0_4_ < 0.0) {
    auVar28._0_4_ = sqrtf(auVar16._0_4_);
    auVar28._4_60_ = extraout_var_00;
    auVar16 = auVar28._0_16_;
    auVar39 = ZEXT416(auVar39._0_4_);
  }
  else {
    auVar16 = vsqrtss_avx(auVar16,auVar16);
  }
  auVar12 = SUB6416(ZEXT464(0x7f800000),0);
  if (auVar16._0_4_ < INFINITY) {
    auVar46._0_12_ = ZEXT812(0);
    auVar46._12_4_ = 0;
    uVar2 = vcmpss_avx512f(auVar16,auVar46,0);
    fVar50 = (float)((uint)!(bool)((byte)uVar2 & 1) * (int)auVar16._0_4_);
    auVar12 = ZEXT416((-(uint)(fVar50 < 0.0) | 1) + (int)fVar50);
  }
  auVar16 = vmaxss_avx(auVar39,ZEXT816(0) << 0x40);
  auVar39 = vminss_avx(auVar12,auVar16);
  auVar16 = vmaxss_avx(auVar12,auVar16);
  auVar16 = vinsertps_avx(auVar39,auVar16,0x10);
  auVar17._8_4_ = 0x40800000;
  auVar17._0_8_ = 0x4080000040800000;
  auVar17._12_4_ = 0x40800000;
  local_b8.super_Vector3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Vector3,_pbrt::Interval<float>_>
  .x = (Interval<float>)vmovlps_avx(auVar17);
  auVar29._0_8_ =
       Interval<float>::operator*<float>
                 ((Interval<float> *)&local_b8,(Interval<float>)local_c8._0_8_);
  auVar29._8_56_ = extraout_var_12;
  local_50 = (Interval<float>)vmovlps_avx(auVar29._0_16_);
  local_38.low = this->radius;
  local_128._0_8_ = auVar16._0_8_;
  local_38.high = local_38.low;
  IVar10 = Interval<float>::operator+<float>(&local_38,(Interval<float>)local_128._0_8_);
  auVar30._0_8_ = Interval<float>::operator*<float>(&local_50,IVar10);
  auVar30._8_56_ = extraout_var_13;
  uVar2 = vmovlps_avx(auVar30._0_16_);
  local_b8.super_Vector3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Vector3,_pbrt::Interval<float>_>
  .x.low = (float)(int)uVar2;
  local_b8.super_Vector3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Vector3,_pbrt::Interval<float>_>
  .x.high = (float)(int)((ulong)uVar2 >> 0x20);
  local_40.low = this->radius;
  local_40.high = local_40.low;
  IVar10 = Interval<float>::operator-<float>(&local_40,(Interval<float>)local_128._0_8_);
  auVar31._0_8_ = Interval<float>::operator*<float>((Interval<float> *)&local_b8,IVar10);
  auVar31._8_56_ = extraout_var_14;
  auVar16 = auVar31._0_16_;
  fVar50 = auVar31._0_4_;
  if (0.0 <= fVar50) {
    if (fVar50 < 0.0) {
      auVar32._0_4_ = sqrtf(fVar50);
      auVar32._4_60_ = extraout_var_01;
      auVar12 = auVar32._0_16_;
    }
    else {
      auVar12 = vsqrtss_avx(auVar16,auVar16);
    }
    auVar39 = SUB6416(ZEXT464(0xff800000),0);
    if (-INFINITY < auVar12._0_4_) {
      uVar2 = vcmpss_avx512f(auVar12,ZEXT816(0) << 0x40,0);
      bVar3 = (bool)((byte)uVar2 & 1);
      fVar50 = (float)((uint)bVar3 * -0x80000000 + (uint)!bVar3 * (int)auVar12._0_4_);
      auVar39 = ZEXT416((int)fVar50 + -1 + (uint)(fVar50 <= 0.0) * 2);
    }
    auVar16 = vmovshdup_avx(auVar16);
    if (auVar16._0_4_ < 0.0) {
      auVar33._0_4_ = sqrtf(auVar16._0_4_);
      auVar33._4_60_ = extraout_var_02;
      auVar16 = auVar33._0_16_;
      auVar39 = ZEXT416(auVar39._0_4_);
    }
    else {
      auVar16 = vsqrtss_avx(auVar16,auVar16);
    }
    auVar12 = SUB6416(ZEXT464(0x7f800000),0);
    if (auVar16._0_4_ < INFINITY) {
      auVar47._0_12_ = ZEXT812(0);
      auVar47._12_4_ = 0;
      uVar2 = vcmpss_avx512f(auVar16,auVar47,0);
      fVar50 = (float)((uint)!(bool)((byte)uVar2 & 1) * (int)auVar16._0_4_);
      auVar12 = ZEXT416((-(uint)(fVar50 < 0.0) | 1) + (int)fVar50);
    }
    auVar16 = vmaxss_avx(auVar39,ZEXT816(0) << 0x40);
    auVar39 = vminss_avx(auVar12,auVar16);
    auVar16 = vmaxss_avx(auVar12,auVar16);
    auVar16 = vinsertps_avx(auVar39,auVar16,0x10);
    if (0.0 <= (local_110.low + local_110.high) * 0.5) {
      IVar10 = Interval<float>::operator+<float>(&local_110,auVar16._0_8_);
    }
    else {
      IVar10 = Interval<float>::operator-<float>(&local_110,auVar16._0_8_);
    }
    auVar48._8_4_ = 0xbf000000;
    auVar48._0_8_ = 0xbf000000bf000000;
    auVar48._12_4_ = 0xbf000000;
    local_b8.super_Vector3<pbrt::Interval<float>_>.
    super_Tuple3<pbrt::Vector3,_pbrt::Interval<float>_>.x = (Interval<float>)vmovlps_avx(auVar48);
    auVar34._0_8_ = Interval<float>::operator*<float>((Interval<float> *)&local_b8,IVar10);
    auVar34._8_56_ = extraout_var_15;
    uVar2 = vmovlps_avx(auVar34._0_16_);
    local_b8.super_Vector3<pbrt::Interval<float>_>.
    super_Tuple3<pbrt::Vector3,_pbrt::Interval<float>_>.x.low = (float)(int)uVar2;
    local_b8.super_Vector3<pbrt::Interval<float>_>.
    super_Tuple3<pbrt::Vector3,_pbrt::Interval<float>_>.x.high = (float)(int)((ulong)uVar2 >> 0x20);
    IVar10 = Interval<float>::operator/<float>
                       ((Interval<float> *)&local_b8,(Interval<float>)local_c8._0_8_);
    local_c8._8_8_ = extraout_XMM0_Qb_01;
    local_c8._0_4_ = IVar10.low;
    local_c8._4_4_ = IVar10.high;
    auVar35._0_8_ =
         Interval<float>::operator/<float>
                   (&local_a0,
                    local_b8.super_Vector3<pbrt::Interval<float>_>.
                    super_Tuple3<pbrt::Vector3,_pbrt::Interval<float>_>.x);
    auVar35._8_56_ = extraout_var_16;
    auVar16 = auVar35._0_16_;
    local_98 = local_c8;
    if (local_c8._0_4_ <= auVar35._0_4_) {
      local_98 = auVar16;
      auVar16 = local_c8;
    }
    local_68 = vmovshdup_avx(auVar16);
    if (((tMax < local_68._0_4_) || (local_98._0_4_ <= 0.0)) ||
       ((local_c8 = auVar16, auVar16._0_4_ <= 0.0 &&
        (local_68 = vmovshdup_avx(local_98), local_c8 = local_98, tMax < local_68._0_4_))))
    goto LAB_002e294a;
    auVar5._4_4_ = local_e8.super_Point3<pbrt::Interval<float>_>.
                   super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
    auVar5._0_4_ = local_e8.super_Point3<pbrt::Interval<float>_>.
                   super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
    auVar5._8_4_ = local_e8.super_Point3<pbrt::Interval<float>_>.
                   super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
    auVar5._12_4_ =
         local_e8.super_Point3<pbrt::Interval<float>_>.
         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
    auVar16 = vinsertps_avx(auVar5,ZEXT416((uint)local_e8.super_Point3<pbrt::Interval<float>_>.
                                                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.
                                                 y.high),0x10);
    fVar38 = (local_c8._0_4_ + local_68._0_4_) * 0.5;
    auVar12 = vinsertps_avx((undefined1  [16])
                            local_108.super_Point3<pbrt::Interval<float>_>.
                            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>._0_16_,
                            ZEXT416((uint)local_108.super_Point3<pbrt::Interval<float>_>.
                                          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high)
                            ,0x10);
    local_78 = ZEXT416((uint)fVar38);
    fVar50 = (local_e8.super_Point3<pbrt::Interval<float>_>.
              super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low +
             local_e8.super_Point3<pbrt::Interval<float>_>.
             super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high) * 0.5 +
             fVar38 * (local_108.super_Point3<pbrt::Interval<float>_>.
                       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low +
                      local_108.super_Point3<pbrt::Interval<float>_>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high) * 0.5;
    auVar18._0_4_ =
         (local_e8.super_Point3<pbrt::Interval<float>_>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high + auVar16._0_4_) * 0.5 +
         fVar38 * (local_108.super_Point3<pbrt::Interval<float>_>.
                   super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high + auVar12._0_4_) * 0.5;
    auVar18._4_4_ =
         (local_e8.super_Point3<pbrt::Interval<float>_>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low + auVar16._4_4_) * 0.5 +
         fVar38 * (local_108.super_Point3<pbrt::Interval<float>_>.
                   super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low + auVar12._4_4_) * 0.5;
    auVar18._8_4_ = (auVar16._8_4_ + 0.0) * 0.5 + fVar38 * (auVar12._8_4_ + 0.0) * 0.5;
    auVar18._12_4_ = (auVar16._12_4_ + 0.0) * 0.5 + fVar38 * (auVar12._12_4_ + 0.0) * 0.5;
    auVar57._0_4_ = auVar18._0_4_ * auVar18._0_4_;
    auVar57._4_4_ = auVar18._4_4_ * auVar18._4_4_;
    auVar57._8_4_ = auVar18._8_4_ * auVar18._8_4_;
    auVar57._12_4_ = auVar18._12_4_ * auVar18._12_4_;
    auVar16 = vmovshdup_avx(auVar57);
    auVar16 = vfmadd231ss_fma(auVar16,auVar18,auVar18);
    auVar16 = vsqrtss_avx(auVar16,auVar16);
    fVar38 = this->radius / auVar16._0_4_;
    local_88._0_4_ = auVar18._0_4_ * fVar38;
    local_88._4_4_ = auVar18._4_4_ * fVar38;
    local_88._8_4_ = auVar18._8_4_ * fVar38;
    local_88._12_4_ = auVar18._12_4_ * fVar38;
    auVar16 = vmovshdup_avx(local_88);
    auVar36._0_4_ = atan2f(auVar16._0_4_,local_88._0_4_);
    auVar36._4_60_ = extraout_var_03;
    if ((this->zMin <= fVar50) && (fVar50 <= this->zMax)) {
      uVar2 = vcmpss_avx512f(auVar36._0_16_,ZEXT816(0) << 0x40,1);
      bVar3 = (bool)((byte)uVar2 & 1);
      fVar38 = (float)((uint)bVar3 * (int)(auVar36._0_4_ + 6.2831855) +
                      (uint)!bVar3 * (int)auVar36._0_4_);
      if (fVar38 <= this->phiMax) goto LAB_002e28eb;
    }
    fVar38 = local_98._0_4_;
    auVar16 = vmovshdup_avx(local_98);
    fVar50 = auVar16._0_4_;
    if (((float)local_c8._0_4_ == fVar38) && (!NAN((float)local_c8._0_4_) && !NAN(fVar38))) {
      if (((float)local_68._0_4_ == fVar50) && (!NAN((float)local_68._0_4_) && !NAN(fVar50)))
      goto LAB_002e294a;
    }
    if (fVar50 <= tMax) {
      auVar6._4_4_ = local_e8.super_Point3<pbrt::Interval<float>_>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
      auVar6._0_4_ = local_e8.super_Point3<pbrt::Interval<float>_>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
      auVar6._8_4_ = local_e8.super_Point3<pbrt::Interval<float>_>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
      auVar6._12_4_ =
           local_e8.super_Point3<pbrt::Interval<float>_>.
           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
      auVar16 = vinsertps_avx(auVar6,ZEXT416((uint)local_e8.super_Point3<pbrt::Interval<float>_>.
                                                                                                      
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .y.high),0x10);
      fVar38 = (fVar38 + fVar50) * 0.5;
      auVar12 = vinsertps_avx((undefined1  [16])
                              local_108.super_Point3<pbrt::Interval<float>_>.
                              super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>._0_16_,
                              ZEXT416((uint)local_108.super_Point3<pbrt::Interval<float>_>.
                                            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.
                                            high),0x10);
      local_78 = ZEXT416((uint)fVar38);
      fVar50 = (local_e8.super_Point3<pbrt::Interval<float>_>.
                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low +
               local_e8.super_Point3<pbrt::Interval<float>_>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high) * 0.5 +
               fVar38 * (local_108.super_Point3<pbrt::Interval<float>_>.
                         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low +
                        local_108.super_Point3<pbrt::Interval<float>_>.
                        super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high) * 0.5;
      auVar19._0_4_ =
           (local_e8.super_Point3<pbrt::Interval<float>_>.
            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high + auVar16._0_4_) * 0.5 +
           fVar38 * (local_108.super_Point3<pbrt::Interval<float>_>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high + auVar12._0_4_) *
                    0.5;
      auVar19._4_4_ =
           (local_e8.super_Point3<pbrt::Interval<float>_>.
            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low + auVar16._4_4_) * 0.5 +
           fVar38 * (local_108.super_Point3<pbrt::Interval<float>_>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low + auVar12._4_4_) * 0.5
      ;
      auVar19._8_4_ = (auVar16._8_4_ + 0.0) * 0.5 + fVar38 * (auVar12._8_4_ + 0.0) * 0.5;
      auVar19._12_4_ = (auVar16._12_4_ + 0.0) * 0.5 + fVar38 * (auVar12._12_4_ + 0.0) * 0.5;
      auVar49._0_4_ = auVar19._0_4_ * auVar19._0_4_;
      auVar49._4_4_ = auVar19._4_4_ * auVar19._4_4_;
      auVar49._8_4_ = auVar19._8_4_ * auVar19._8_4_;
      auVar49._12_4_ = auVar19._12_4_ * auVar19._12_4_;
      auVar16 = vmovshdup_avx(auVar49);
      auVar16 = vfmadd231ss_fma(auVar16,auVar19,auVar19);
      auVar16 = vsqrtss_avx(auVar16,auVar16);
      fVar38 = this->radius / auVar16._0_4_;
      local_88._0_4_ = auVar19._0_4_ * fVar38;
      local_88._4_4_ = auVar19._4_4_ * fVar38;
      local_88._8_4_ = auVar19._8_4_ * fVar38;
      local_88._12_4_ = auVar19._12_4_ * fVar38;
      auVar16 = vmovshdup_avx(local_88);
      auVar37._0_4_ = atan2f(auVar16._0_4_,local_88._0_4_);
      auVar37._4_60_ = extraout_var_04;
      if ((this->zMin <= fVar50) && (fVar50 <= this->zMax)) {
        uVar2 = vcmpss_avx512f(auVar37._0_16_,ZEXT816(0) << 0x40,1);
        bVar3 = (bool)((byte)uVar2 & 1);
        fVar38 = (float)((uint)bVar3 * (int)(auVar37._0_4_ + 6.2831855) +
                        (uint)!bVar3 * (int)auVar37._0_4_);
        if (fVar38 <= this->phiMax) {
LAB_002e28eb:
          __return_storage_ptr__->set = true;
          (__return_storage_ptr__->optionalValue).__align =
               (anon_struct_4_0_00000001_for___align)local_78._0_4_;
          uVar2 = vmovlps_avx(local_88);
          *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 4) = uVar2;
          *(float *)((long)&__return_storage_ptr__->optionalValue + 0xc) = fVar50;
          *(float *)((long)&__return_storage_ptr__->optionalValue + 0x10) = fVar38;
          return __return_storage_ptr__;
        }
      }
    }
  }
LAB_002e294a:
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
  *(undefined8 *)&__return_storage_ptr__->optionalValue = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU
    pstd::optional<QuadricIntersection> BasicIntersect(const Ray &r, Float tMax) const {
        Float phi;
        Point3f pHit;
        // Transform _Ray_ origin and direction to object space
        Point3fi oi = (*objectFromRender)(Point3fi(r.o));
        Vector3fi di = (*objectFromRender)(Vector3fi(r.d));

        // Solve quadratic equation to find cylinder _t0_ and _t1_ values
        FloatInterval t0, t1;
        // Compute cylinder quadratic coefficients
        FloatInterval a = SumSquares(di.x, di.y);
        FloatInterval b = 2 * (di.x * oi.x + di.y * oi.y);
        FloatInterval c = SumSquares(oi.x, oi.y) - Sqr(FloatInterval(radius));

        // Compute cylinder quadratic discriminant _discrim_
        FloatInterval f = b / (2 * a);
        FloatInterval fx = oi.x - f * di.x, fy = oi.y - f * di.y;
        FloatInterval sqrtf = Sqrt(Sqr(fx) + Sqr(fy));
        FloatInterval discrim =
            4 * a * (FloatInterval(radius) + sqrtf) * (FloatInterval(radius) - sqrtf);
        if (discrim.LowerBound() < 0)
            return {};

        // Compute quadratic $t$ values
        FloatInterval rootDiscrim = Sqrt(discrim);
        FloatInterval q;
        if ((Float)b < 0)
            q = -.5f * (b - rootDiscrim);
        else
            q = -.5f * (b + rootDiscrim);
        t0 = q / a;
        t1 = c / q;
        // Swap quadratic $t$ values so that _t0_ is the lesser
        if (t0.LowerBound() > t1.LowerBound())
            pstd::swap(t0, t1);

        // Check quadric shape _t0_ and _t1_ for nearest intersection
        if (t0.UpperBound() > tMax || t1.LowerBound() <= 0)
            return {};
        FloatInterval tShapeHit = t0;
        if (tShapeHit.LowerBound() <= 0) {
            tShapeHit = t1;
            if (tShapeHit.UpperBound() > tMax)
                return {};
        }

        // Compute cylinder hit point and $\phi$
        pHit = Point3f(oi) + (Float)tShapeHit * Vector3f(di);
        // Refine cylinder intersection point
        Float hitRad = std::sqrt(pHit.x * pHit.x + pHit.y * pHit.y);
        pHit.x *= radius / hitRad;
        pHit.y *= radius / hitRad;

        phi = std::atan2(pHit.y, pHit.x);
        if (phi < 0)
            phi += 2 * Pi;

        // Test cylinder intersection against clipping parameters
        if (pHit.z < zMin || pHit.z > zMax || phi > phiMax) {
            if (tShapeHit == t1)
                return {};
            tShapeHit = t1;
            if (t1.UpperBound() > tMax)
                return {};
            // Compute cylinder hit point and $\phi$
            pHit = Point3f(oi) + (Float)tShapeHit * Vector3f(di);
            // Refine cylinder intersection point
            Float hitRad = std::sqrt(pHit.x * pHit.x + pHit.y * pHit.y);
            pHit.x *= radius / hitRad;
            pHit.y *= radius / hitRad;

            phi = std::atan2(pHit.y, pHit.x);
            if (phi < 0)
                phi += 2 * Pi;

            if (pHit.z < zMin || pHit.z > zMax || phi > phiMax)
                return {};
        }

        // Return _QuadricIntersection_ for cylinder intersection
        return QuadricIntersection{(Float)tShapeHit, pHit, phi};
    }